

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# versionbits_tests.cpp
# Opt level: O0

VersionBitsTester * __thiscall
VersionBitsTester::Mine(VersionBitsTester *this,uint height,int32_t nTime,int32_t nVersion)

{
  long lVar1;
  size_type sVar2;
  VersionBitsTester *this_00;
  CBlockIndex *pCVar3;
  int32_t in_ECX;
  undefined4 in_EDX;
  uint in_ESI;
  VersionBitsTester *in_RDI;
  long in_FS_OFFSET;
  CBlockIndex *pindex;
  vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_> *in_stack_ffffffffffffff88;
  value_type *in_stack_ffffffffffffff90;
  VersionBitsTester *this_01;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  while( true ) {
    sVar2 = std::vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>::size
                      (in_stack_ffffffffffffff88);
    if (in_ESI <= sVar2) break;
    this_00 = (VersionBitsTester *)operator_new(0x98);
    this_00->checker[1].cache._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0
    ;
    this_00->checker[1].cache._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    this_00->checker[1].cache._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    this_00->checker[1].cache._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    *(undefined8 *)&this_00->checker[1].cache._M_t._M_impl = 0;
    *(undefined8 *)&this_00->checker[1].cache._M_t._M_impl.super__Rb_tree_header._M_header = 0;
    this_00->checker[0].cache._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    this_00->checker[1].super_AbstractThresholdConditionChecker.
    _vptr_AbstractThresholdConditionChecker = (_func_int **)0x0;
    this_00->checker[0].cache._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    this_00->checker[0].cache._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0
    ;
    *(undefined8 *)&this_00->checker[0].cache._M_t._M_impl.super__Rb_tree_header._M_header = 0;
    this_00->checker[0].cache._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    this_00->checker[0].super_AbstractThresholdConditionChecker.
    _vptr_AbstractThresholdConditionChecker = (_func_int **)0x0;
    *(undefined8 *)&this_00->checker[0].cache._M_t._M_impl = 0;
    (this_00->vpblock).super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (this_00->vpblock).super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this_00->m_rng = (FastRandomContext *)0x0;
    (this_00->vpblock).super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    this_00->checker[2].super_AbstractThresholdConditionChecker.
    _vptr_AbstractThresholdConditionChecker = (_func_int **)0x0;
    this_01 = this_00;
    CBlockIndex::CBlockIndex((CBlockIndex *)this_00);
    sVar2 = std::vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>::size
                      (in_stack_ffffffffffffff88);
    *(int *)&(this_00->vpblock).super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage = (int)sVar2;
    pCVar3 = Tip(this_01);
    (this_00->vpblock).super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)pCVar3;
    *(undefined4 *)&this_00->checker[1].cache._M_t._M_impl.super__Rb_tree_header._M_header._M_right
         = in_EDX;
    *(int32_t *)
     ((long)&this_00->checker[1].super_AbstractThresholdConditionChecker.
             _vptr_AbstractThresholdConditionChecker + 4) = in_ECX;
    CBlockIndex::BuildSkip((CBlockIndex *)this_01);
    std::vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>::push_back
              ((vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_> *)this_01,
               in_stack_ffffffffffffff90);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

VersionBitsTester& Mine(unsigned int height, int32_t nTime, int32_t nVersion) {
        while (vpblock.size() < height) {
            CBlockIndex* pindex = new CBlockIndex();
            pindex->nHeight = vpblock.size();
            pindex->pprev = Tip();
            pindex->nTime = nTime;
            pindex->nVersion = nVersion;
            pindex->BuildSkip();
            vpblock.push_back(pindex);
        }
        return *this;
    }